

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AnalysisLoad(sqlite3 *db,int iDb)

{
  Db *pDVar1;
  int iVar2;
  Table *pTVar3;
  char *zSql;
  HashElem *pHVar4;
  analysisInfo sInfo;
  sqlite3 *local_30;
  char *local_28;
  
  pDVar1 = db->aDb;
  for (pHVar4 = ((pDVar1[iDb].pSchema)->idxHash).first; pHVar4 != (HashElem *)0x0;
      pHVar4 = pHVar4->next) {
    **(undefined2 **)((long)pHVar4->data + 0x10) = 0;
  }
  local_28 = pDVar1[iDb].zDbSName;
  local_30 = db;
  pTVar3 = sqlite3FindTable(db,"sqlite_stat1",local_28);
  if (pTVar3 == (Table *)0x0) {
    iVar2 = 0;
  }
  else {
    zSql = sqlite3MPrintf(db,"SELECT tbl,idx,stat FROM %Q.sqlite_stat1",local_28);
    if (zSql == (char *)0x0) {
      iVar2 = 7;
    }
    else {
      iVar2 = sqlite3_exec(db,zSql,analysisLoader,&local_30,(char **)0x0);
      sqlite3DbFree(db,zSql);
    }
  }
  for (pHVar4 = ((db->aDb[iDb].pSchema)->idxHash).first; pHVar4 != (HashElem *)0x0;
      pHVar4 = pHVar4->next) {
    if (*((Index *)pHVar4->data)->aiRowLogEst == 0) {
      sqlite3DefaultRowEst((Index *)pHVar4->data);
    }
  }
  if (((iVar2 == 7) && (db->mallocFailed == '\0')) && (db->bBenignMalloc == '\0')) {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3AnalysisLoad(sqlite3 *db, int iDb){
  analysisInfo sInfo;
  HashElem *i;
  char *zSql;
  int rc = SQLITE_OK;

  assert( iDb>=0 && iDb<db->nDb );
  assert( db->aDb[iDb].pBt!=0 );

  /* Clear any prior statistics */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&db->aDb[iDb].pSchema->idxHash);i;i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    pIdx->aiRowLogEst[0] = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3DeleteIndexSamples(db, pIdx);
    pIdx->aSample = 0;
#endif
  }

  /* Load new statistics out of the sqlite_stat1 table */
  sInfo.db = db;
  sInfo.zDatabase = db->aDb[iDb].zDbSName;
  if( sqlite3FindTable(db, "sqlite_stat1", sInfo.zDatabase)!=0 ){
    zSql = sqlite3MPrintf(db, 
        "SELECT tbl,idx,stat FROM %Q.sqlite_stat1", sInfo.zDatabase);
    if( zSql==0 ){
      rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3_exec(db, zSql, analysisLoader, &sInfo, 0);
      sqlite3DbFree(db, zSql);
    }
  }

  /* Set appropriate defaults on all indexes not in the sqlite_stat1 table */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&db->aDb[iDb].pSchema->idxHash);i;i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    if( pIdx->aiRowLogEst[0]==0 ) sqlite3DefaultRowEst(pIdx);
  }

  /* Load the statistics from the sqlite_stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( rc==SQLITE_OK && OptimizationEnabled(db, SQLITE_Stat34) ){
    db->lookaside.bDisable++;
    rc = loadStat4(db, sInfo.zDatabase);
    db->lookaside.bDisable--;
  }
  for(i=sqliteHashFirst(&db->aDb[iDb].pSchema->idxHash);i;i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    sqlite3_free(pIdx->aiRowEst);
    pIdx->aiRowEst = 0;
  }
#endif

  if( rc==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return rc;
}